

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O3

void wwTrimLo(word *a,size_t n,size_t pos)

{
  ulong uVar1;
  sbyte sVar2;
  
  uVar1 = pos >> 6;
  if ((uVar1 < n) && (n = uVar1, (pos & 0x3f) != 0)) {
    sVar2 = (sbyte)(pos & 0x3f);
    a[uVar1] = (a[uVar1] >> sVar2) << sVar2;
  }
  if (n == 0) {
    return;
  }
  memset(a,0,n << 3);
  return;
}

Assistant:

void wwTrimLo(word a[], size_t n, size_t pos)
{
	size_t i = pos / B_PER_W;
	ASSERT(wwIsValid(a, n));
	if (i < n)
	{
		// очистить биты слова a[i]
		if (pos %= B_PER_W)
			a[i] >>= pos, a[i] <<= pos;
	}
	else if (i > n)
		i = n;
	// очистить остальные слова
	while (i)
		a[--i] = 0;
}